

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O2

S2CellId __thiscall S2CellId::child(S2CellId *this,int position)

{
  ulong uVar1;
  S2LogMessage SStack_18;
  
  uVar1 = this->id_;
  if (((uint)(uVar1 >> 0x3e) < 3) && ((uVar1 & 0x1555555555555555 & -uVar1) != 0)) {
    if ((uVar1 & 1) == 0) {
      return (S2CellId)((long)(position * 2 + -3) * ((-uVar1 & uVar1) >> 2) + uVar1);
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x272,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: !is_leaf() ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x271,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: is_valid() ");
  }
  abort();
}

Assistant:

inline S2CellId S2CellId::child(int position) const {
  S2_DCHECK(is_valid());
  S2_DCHECK(!is_leaf());
  // To change the level, we need to move the least-significant bit two
  // positions downward.  We do this by subtracting (4 * new_lsb) and adding
  // new_lsb.  Then to advance to the given child cell, we add
  // (2 * position * new_lsb).
  uint64 new_lsb = lsb() >> 2;
  return S2CellId(id_ + (2 * position + 1 - 4) * new_lsb);
}